

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_decoder.c
# Opt level: O1

lzma_ret lzma_decode(void *coder_ptr,lzma_dict *dictptr,uint8_t *in,size_t *in_pos,size_t in_size)

{
  byte *pbVar1;
  ushort uVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  undefined4 uVar6;
  ulong uVar7;
  ulong uVar8;
  uint8_t *__src;
  size_t sVar9;
  bool bVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  lzma_ret lVar15;
  size_t sVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  ushort *puVar26;
  ulong uVar27;
  size_t sVar28;
  long lVar29;
  lzma_lzma_state lVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  void *pvVar34;
  uint local_e0;
  uint local_dc;
  ulong local_d8;
  ulong local_c8;
  ulong local_c0;
  uint local_ac;
  
  iVar21 = *(int *)((long)coder_ptr + 0x6e74);
  bVar10 = true;
  if (iVar21 == 0) {
    lVar15 = LZMA_STREAM_END;
  }
  else {
    sVar28 = *in_pos;
    lVar15 = LZMA_OK;
    lVar29 = 0;
    iVar23 = iVar21;
    do {
      iVar23 = iVar23 + -1;
      if ((sVar28 - in_size) + lVar29 == 0) {
LAB_001a4955:
        bVar10 = false;
        goto LAB_001a495d;
      }
      if (((int)lVar29 - iVar21 == -5) && (in[lVar29 + sVar28] != '\0')) {
        lVar15 = LZMA_DATA_ERROR;
        goto LAB_001a4955;
      }
      *(uint *)((long)coder_ptr + 0x6e70) =
           (uint)in[lVar29 + sVar28] | *(int *)((long)coder_ptr + 0x6e70) << 8;
      *in_pos = sVar28 + lVar29 + 1;
      *(int *)((long)coder_ptr + 0x6e74) = iVar23;
      lVar29 = lVar29 + 1;
    } while ((int)lVar29 != iVar21);
    lVar15 = LZMA_STREAM_END;
  }
LAB_001a495d:
  if (!bVar10) {
    return lVar15;
  }
  uVar7 = dictptr->pos;
  local_c0 = dictptr->full;
  uVar24 = dictptr->limit;
  uVar32 = *(uint *)((long)coder_ptr + 0x6e6c);
  uVar12 = *(uint *)((long)coder_ptr + 0x6e70);
  uVar3 = *(undefined4 *)((long)coder_ptr + 0x6e74);
  sVar28 = *in_pos;
  lVar30 = *(lzma_lzma_state *)((long)coder_ptr + 0x6e78);
  uVar27 = (ulong)*(uint *)((long)coder_ptr + 0x6e7c);
  local_dc = *(uint *)((long)coder_ptr + 0x6e80);
  local_e0 = *(uint *)((long)coder_ptr + 0x6e84);
  local_ac = *(uint *)((long)coder_ptr + 0x6e88);
  pvVar34 = *(void **)((long)coder_ptr + 0x6ea8);
  uVar8 = *(ulong *)((long)coder_ptr + 0x6e98);
  uVar20 = uVar8 + uVar7;
  if (uVar24 - uVar7 <= uVar8) {
    uVar20 = uVar24;
  }
  if (uVar8 == 0xffffffffffffffff) {
    uVar20 = uVar24;
  }
  uVar24 = (ulong)*(uint *)((long)coder_ptr + 0x6eb0);
  uVar18 = *(uint *)((long)coder_ptr + 0x6eb4);
  uVar14 = *(uint *)((long)coder_ptr + 0x6eb8);
  uVar17 = (ulong)*(uint *)((long)coder_ptr + 0x6ebc);
  local_c8 = uVar7;
  if (*(uint *)((long)coder_ptr + 0x6ea0) < 0x47) {
    __src = dictptr->buf;
    sVar9 = dictptr->size;
    uVar4 = *(uint *)((long)coder_ptr + 0x6e8c);
    uVar5 = *(uint *)((long)coder_ptr + 0x6e94);
    uVar6 = *(undefined4 *)((long)coder_ptr + 0x6e90);
    local_d8 = (ulong)((uint)uVar7 & uVar4);
    uVar22 = uVar24;
    uVar25 = uVar24;
    uVar31 = uVar12;
    uVar33 = uVar12;
    uVar13 = uVar14;
    switch(*(uint *)((long)coder_ptr + 0x6ea0)) {
    default:
switchD_001a4aa6_caseD_0:
      if ((uVar8 != 0xffffffffffffffff) && (local_c8 == uVar20)) break;
      uVar33 = uVar32;
      if (uVar32 < 0x1000000) {
        if (sVar28 == in_size) goto LAB_001a7cad;
        pbVar1 = in + sVar28;
        sVar28 = sVar28 + 1;
        uVar12 = uVar12 << 8 | (uint)*pbVar1;
        uVar33 = uVar32 << 8;
      }
      puVar26 = (ushort *)((long)coder_ptr + local_d8 * 2 + (ulong)lVar30 * 0x20 + 0x6000);
      uVar2 = *puVar26;
      uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
      uVar31 = uVar12 - uVar32;
      if (uVar12 < uVar32) {
        *puVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
        bVar11 = (byte)uVar6;
        sVar16 = 0;
        if (local_c8 == 0) {
          sVar16 = sVar9;
        }
        pvVar34 = (void *)(((ulong)(__src[(sVar16 - 1) + local_c8] >> (8 - bVar11 & 0x1f)) +
                           ((ulong)((uint)local_c8 & uVar5) << (bVar11 & 0x3f))) * 0x600 +
                          (long)coder_ptr);
        uVar24 = 1;
        if (lVar30 < STATE_LIT_MATCH) {
switchD_001a4aa6_caseD_2:
          uVar33 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 2;
              uVar31 = uVar12;
              goto LAB_001a7605;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar12 = uVar12 << 8 | (uint)*pbVar1;
            uVar33 = uVar32 << 8;
          }
          uVar2 = *(ushort *)((long)pvVar34 + uVar24 * 2);
          uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
          uVar13 = (int)uVar24 * 2;
          uVar25 = (ulong)uVar13;
          uVar31 = uVar12 - uVar32;
          if (uVar12 < uVar32) {
            *(ushort *)((long)pvVar34 + uVar24 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar31 = uVar12;
          }
          else {
            uVar32 = uVar33 - uVar32;
            *(ushort *)((long)pvVar34 + uVar24 * 2) = uVar2 - (uVar2 >> 5);
            uVar25 = (ulong)(uVar13 | 1);
          }
switchD_001a4aa6_caseD_3:
          uVar33 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 3;
              uVar24 = uVar25;
              goto LAB_001a7605;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar31 = uVar31 << 8 | (uint)*pbVar1;
            uVar33 = uVar32 << 8;
          }
          uVar2 = *(ushort *)((long)pvVar34 + uVar25 * 2);
          uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
          uVar13 = (int)uVar25 * 2;
          uVar22 = (ulong)uVar13;
          uVar12 = uVar31 - uVar32;
          if (uVar31 < uVar32) {
            *(ushort *)((long)pvVar34 + uVar25 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar12 = uVar31;
          }
          else {
            uVar32 = uVar33 - uVar32;
            *(ushort *)((long)pvVar34 + uVar25 * 2) = uVar2 - (uVar2 >> 5);
            uVar22 = (ulong)(uVar13 | 1);
          }
switchD_001a4aa6_caseD_4:
          uVar33 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 4;
              uVar24 = uVar22;
              uVar31 = uVar12;
              goto LAB_001a7605;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar12 = uVar12 << 8 | (uint)*pbVar1;
            uVar33 = uVar32 << 8;
          }
          uVar2 = *(ushort *)((long)pvVar34 + uVar22 * 2);
          uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
          uVar13 = (int)uVar22 * 2;
          uVar24 = (ulong)uVar13;
          uVar31 = uVar12 - uVar32;
          if (uVar12 < uVar32) {
            *(ushort *)((long)pvVar34 + uVar22 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar31 = uVar12;
          }
          else {
            uVar32 = uVar33 - uVar32;
            *(ushort *)((long)pvVar34 + uVar22 * 2) = uVar2 - (uVar2 >> 5);
            uVar24 = (ulong)(uVar13 | 1);
          }
switchD_001a4aa6_caseD_5:
          uVar33 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 5;
              goto LAB_001a7605;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar31 = uVar31 << 8 | (uint)*pbVar1;
            uVar33 = uVar32 << 8;
          }
          uVar2 = *(ushort *)((long)pvVar34 + uVar24 * 2);
          uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
          uVar13 = (int)uVar24 * 2;
          uVar22 = (ulong)uVar13;
          uVar12 = uVar31 - uVar32;
          if (uVar31 < uVar32) {
            *(ushort *)((long)pvVar34 + uVar24 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar12 = uVar31;
          }
          else {
            uVar32 = uVar33 - uVar32;
            *(ushort *)((long)pvVar34 + uVar24 * 2) = uVar2 - (uVar2 >> 5);
            uVar22 = (ulong)(uVar13 | 1);
          }
switchD_001a4aa6_caseD_6:
          uVar33 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 6;
              uVar24 = uVar22;
              uVar31 = uVar12;
              goto LAB_001a7605;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar12 = uVar12 << 8 | (uint)*pbVar1;
            uVar33 = uVar32 << 8;
          }
          uVar2 = *(ushort *)((long)pvVar34 + uVar22 * 2);
          uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
          uVar13 = (int)uVar22 * 2;
          uVar24 = (ulong)uVar13;
          uVar31 = uVar12 - uVar32;
          if (uVar12 < uVar32) {
            *(ushort *)((long)pvVar34 + uVar22 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar31 = uVar12;
          }
          else {
            uVar32 = uVar33 - uVar32;
            *(ushort *)((long)pvVar34 + uVar22 * 2) = uVar2 - (uVar2 >> 5);
            uVar24 = (ulong)(uVar13 | 1);
          }
switchD_001a4aa6_caseD_7:
          uVar33 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 7;
              goto LAB_001a7605;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar31 = (uint)*pbVar1 | uVar31 << 8;
            uVar33 = uVar32 << 8;
          }
          uVar2 = *(ushort *)((long)pvVar34 + uVar24 * 2);
          uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
          uVar13 = (int)uVar24 * 2;
          uVar22 = (ulong)uVar13;
          uVar12 = uVar31 - uVar32;
          if (uVar31 < uVar32) {
            *(ushort *)((long)pvVar34 + uVar24 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar12 = uVar31;
          }
          else {
            uVar32 = uVar33 - uVar32;
            *(ushort *)((long)pvVar34 + uVar24 * 2) = uVar2 - (uVar2 >> 5);
            uVar22 = (ulong)(uVar13 | 1);
          }
switchD_001a4aa6_caseD_8:
          uVar33 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 8;
              uVar24 = uVar22;
              uVar31 = uVar12;
              goto LAB_001a7605;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar12 = (uint)*pbVar1 | uVar12 << 8;
            uVar33 = uVar32 << 8;
          }
          uVar2 = *(ushort *)((long)pvVar34 + uVar22 * 2);
          uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
          uVar13 = (int)uVar22 * 2;
          uVar24 = (ulong)uVar13;
          uVar31 = uVar12 - uVar32;
          if (uVar12 < uVar32) {
            *(ushort *)((long)pvVar34 + uVar22 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar31 = uVar12;
          }
          else {
            uVar32 = uVar33 - uVar32;
            *(ushort *)((long)pvVar34 + uVar22 * 2) = uVar2 - (uVar2 >> 5);
            uVar24 = (ulong)(uVar13 | 1);
          }
switchD_001a4aa6_caseD_9:
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 9;
              goto LAB_001a7605;
            }
            uVar32 = uVar32 << 8;
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar31 = (uint)*pbVar1 | uVar31 << 8;
          }
          uVar2 = *(ushort *)((long)pvVar34 + uVar24 * 2);
          uVar13 = (uVar32 >> 0xb) * (uint)uVar2;
          uVar33 = (int)uVar24 * 2;
          uVar22 = (ulong)uVar33;
          uVar12 = uVar31 - uVar13;
          if (uVar31 < uVar13) {
            *(ushort *)((long)pvVar34 + uVar24 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar12 = uVar31;
            uVar32 = uVar13;
          }
          else {
            uVar32 = uVar32 - uVar13;
            *(ushort *)((long)pvVar34 + uVar24 * 2) = uVar2 - (uVar2 >> 5);
            uVar22 = (ulong)(uVar33 | 1);
          }
        }
        else {
          sVar16 = 0;
          if (local_c8 <= uVar27) {
            sVar16 = sVar9;
          }
          uVar17 = (ulong)((uint)__src[sVar16 + ~uVar27 + local_c8] * 2);
          uVar14 = 0x100;
          uVar24 = 1;
switchD_001a4aa6_caseD_a:
          uVar13 = uVar14 & (uint)uVar17;
          uVar31 = uVar12;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 10;
              goto LAB_001a7605;
            }
            uVar32 = uVar32 << 8;
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar31 = (uint)*pbVar1 | uVar12 << 8;
          }
          uVar22 = (ulong)(uVar14 + (int)uVar24 + uVar13);
          uVar2 = *(ushort *)((long)pvVar34 + uVar22 * 2);
          uVar19 = (uVar32 >> 0xb) * (uint)uVar2;
          uVar33 = (int)uVar24 * 2;
          uVar12 = uVar31 - uVar19;
          if (uVar31 < uVar19) {
            *(ushort *)((long)pvVar34 + uVar22 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar13 = uVar13 ^ uVar14;
            uVar12 = uVar31;
            uVar32 = uVar19;
          }
          else {
            uVar32 = uVar32 - uVar19;
            *(ushort *)((long)pvVar34 + uVar22 * 2) = uVar2 - (uVar2 >> 5);
            uVar33 = uVar33 | 1;
          }
          uVar24 = (ulong)uVar33;
          uVar17 = (ulong)((uint)uVar17 * 2);
switchD_001a4aa6_caseD_b:
          uVar14 = uVar13 & (uint)uVar17;
          uVar31 = uVar12;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0xb;
              uVar14 = uVar13;
              goto LAB_001a7605;
            }
            uVar32 = uVar32 << 8;
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar31 = (uint)*pbVar1 | uVar12 << 8;
          }
          uVar22 = (ulong)(uVar13 + (int)uVar24 + uVar14);
          uVar2 = *(ushort *)((long)pvVar34 + uVar22 * 2);
          uVar19 = (uVar32 >> 0xb) * (uint)uVar2;
          uVar33 = (int)uVar24 * 2;
          uVar12 = uVar31 - uVar19;
          if (uVar31 < uVar19) {
            *(ushort *)((long)pvVar34 + uVar22 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar14 = uVar14 ^ uVar13;
            uVar12 = uVar31;
            uVar32 = uVar19;
          }
          else {
            uVar32 = uVar32 - uVar19;
            *(ushort *)((long)pvVar34 + uVar22 * 2) = uVar2 - (uVar2 >> 5);
            uVar33 = uVar33 | 1;
          }
          uVar24 = (ulong)uVar33;
          uVar17 = (ulong)((uint)uVar17 * 2);
switchD_001a4aa6_caseD_c:
          uVar13 = uVar14 & (uint)uVar17;
          uVar31 = uVar12;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0xc;
              goto LAB_001a7605;
            }
            uVar32 = uVar32 << 8;
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar31 = (uint)*pbVar1 | uVar12 << 8;
          }
          uVar22 = (ulong)(uVar14 + (int)uVar24 + uVar13);
          uVar2 = *(ushort *)((long)pvVar34 + uVar22 * 2);
          uVar19 = (uVar32 >> 0xb) * (uint)uVar2;
          uVar33 = (int)uVar24 * 2;
          uVar12 = uVar31 - uVar19;
          if (uVar31 < uVar19) {
            *(ushort *)((long)pvVar34 + uVar22 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar13 = uVar13 ^ uVar14;
            uVar12 = uVar31;
            uVar32 = uVar19;
          }
          else {
            uVar32 = uVar32 - uVar19;
            *(ushort *)((long)pvVar34 + uVar22 * 2) = uVar2 - (uVar2 >> 5);
            uVar33 = uVar33 | 1;
          }
          uVar24 = (ulong)uVar33;
          uVar17 = (ulong)((uint)uVar17 * 2);
switchD_001a4aa6_caseD_d:
          uVar14 = uVar13 & (uint)uVar17;
          uVar31 = uVar12;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0xd;
              uVar14 = uVar13;
              goto LAB_001a7605;
            }
            uVar32 = uVar32 << 8;
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar31 = (uint)*pbVar1 | uVar12 << 8;
          }
          uVar22 = (ulong)(uVar13 + (int)uVar24 + uVar14);
          uVar2 = *(ushort *)((long)pvVar34 + uVar22 * 2);
          uVar19 = (uVar32 >> 0xb) * (uint)uVar2;
          uVar33 = (int)uVar24 * 2;
          uVar12 = uVar31 - uVar19;
          if (uVar31 < uVar19) {
            *(ushort *)((long)pvVar34 + uVar22 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar14 = uVar14 ^ uVar13;
            uVar12 = uVar31;
            uVar32 = uVar19;
          }
          else {
            uVar32 = uVar32 - uVar19;
            *(ushort *)((long)pvVar34 + uVar22 * 2) = uVar2 - (uVar2 >> 5);
            uVar33 = uVar33 | 1;
          }
          uVar24 = (ulong)uVar33;
          uVar17 = (ulong)((uint)uVar17 * 2);
switchD_001a4aa6_caseD_e:
          uVar13 = uVar14 & (uint)uVar17;
          uVar31 = uVar12;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0xe;
              goto LAB_001a7605;
            }
            uVar32 = uVar32 << 8;
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar31 = (uint)*pbVar1 | uVar12 << 8;
          }
          uVar22 = (ulong)(uVar14 + (int)uVar24 + uVar13);
          uVar2 = *(ushort *)((long)pvVar34 + uVar22 * 2);
          uVar19 = (uVar32 >> 0xb) * (uint)uVar2;
          uVar33 = (int)uVar24 * 2;
          uVar12 = uVar31 - uVar19;
          if (uVar31 < uVar19) {
            *(ushort *)((long)pvVar34 + uVar22 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar13 = uVar13 ^ uVar14;
            uVar12 = uVar31;
            uVar32 = uVar19;
          }
          else {
            uVar32 = uVar32 - uVar19;
            *(ushort *)((long)pvVar34 + uVar22 * 2) = uVar2 - (uVar2 >> 5);
            uVar33 = uVar33 | 1;
          }
          uVar24 = (ulong)uVar33;
          uVar17 = (ulong)((uint)uVar17 * 2);
switchD_001a4aa6_caseD_f:
          uVar14 = uVar13 & (uint)uVar17;
          uVar31 = uVar12;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0xf;
              uVar14 = uVar13;
              goto LAB_001a7605;
            }
            uVar32 = uVar32 << 8;
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar31 = (uint)*pbVar1 | uVar12 << 8;
          }
          uVar22 = (ulong)(uVar13 + (int)uVar24 + uVar14);
          uVar2 = *(ushort *)((long)pvVar34 + uVar22 * 2);
          uVar19 = (uVar32 >> 0xb) * (uint)uVar2;
          uVar33 = (int)uVar24 * 2;
          uVar12 = uVar31 - uVar19;
          if (uVar31 < uVar19) {
            *(ushort *)((long)pvVar34 + uVar22 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar14 = uVar14 ^ uVar13;
            uVar12 = uVar31;
            uVar32 = uVar19;
          }
          else {
            uVar32 = uVar32 - uVar19;
            *(ushort *)((long)pvVar34 + uVar22 * 2) = uVar2 - (uVar2 >> 5);
            uVar33 = uVar33 | 1;
          }
          uVar24 = (ulong)uVar33;
          uVar17 = (ulong)((uint)uVar17 * 2);
switchD_001a4aa6_caseD_10:
          uVar13 = uVar14 & (uint)uVar17;
          uVar31 = uVar12;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x10;
              goto LAB_001a7605;
            }
            uVar32 = uVar32 << 8;
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar31 = (uint)*pbVar1 | uVar12 << 8;
          }
          uVar22 = (ulong)(uVar14 + (int)uVar24 + uVar13);
          uVar2 = *(ushort *)((long)pvVar34 + uVar22 * 2);
          uVar19 = (uVar32 >> 0xb) * (uint)uVar2;
          uVar33 = (int)uVar24 * 2;
          uVar12 = uVar31 - uVar19;
          if (uVar31 < uVar19) {
            *(ushort *)((long)pvVar34 + uVar22 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar13 = uVar13 ^ uVar14;
            uVar12 = uVar31;
            uVar32 = uVar19;
          }
          else {
            uVar32 = uVar32 - uVar19;
            *(ushort *)((long)pvVar34 + uVar22 * 2) = uVar2 - (uVar2 >> 5);
            uVar33 = uVar33 | 1;
          }
          uVar24 = (ulong)uVar33;
          uVar17 = (ulong)((uint)uVar17 * 2);
switchD_001a4aa6_caseD_11:
          uVar14 = uVar13 & (uint)uVar17;
          uVar31 = uVar12;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x11;
              uVar14 = uVar13;
              goto LAB_001a7605;
            }
            uVar32 = uVar32 << 8;
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar31 = (uint)*pbVar1 | uVar12 << 8;
          }
          uVar22 = (ulong)(uVar13 + (int)uVar24 + uVar14);
          uVar2 = *(ushort *)((long)pvVar34 + uVar22 * 2);
          uVar19 = (uVar32 >> 0xb) * (uint)uVar2;
          uVar33 = (int)uVar24 * 2;
          uVar12 = uVar31 - uVar19;
          if (uVar31 < uVar19) {
            *(ushort *)((long)pvVar34 + uVar22 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar14 = uVar14 ^ uVar13;
            uVar12 = uVar31;
            uVar32 = uVar19;
          }
          else {
            uVar32 = uVar32 - uVar19;
            *(ushort *)((long)pvVar34 + uVar22 * 2) = uVar2 - (uVar2 >> 5);
            uVar33 = uVar33 | 1;
          }
          uVar22 = (ulong)uVar33;
        }
        lVar30 = lzma_decode::next_state[lVar30];
        uVar24 = uVar22;
switchD_001a4aa6_caseD_12:
        uVar22 = local_c8;
        if (local_c8 != uVar20) {
          uVar22 = local_c8 + 1;
          __src[local_c8] = (uint8_t)uVar24;
          if (local_c0 < uVar22) {
            local_c0 = uVar22;
          }
        }
        if (local_c8 == uVar20) {
          *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x12;
          uVar31 = uVar12;
          local_c8 = uVar22;
          goto LAB_001a7605;
        }
      }
      else {
        uVar32 = uVar33 - uVar32;
        *puVar26 = uVar2 - (uVar2 >> 5);
switchD_001a4aa6_caseD_13:
        uVar33 = local_e0;
        local_e0 = local_dc;
        uVar22 = (ulong)lVar30;
        uVar13 = uVar32;
        uVar12 = uVar31;
        if (uVar32 < 0x1000000) {
          if (sVar28 == in_size) {
            *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x13;
            lVar15 = LZMA_OK;
            bVar10 = true;
            local_e0 = uVar33;
            goto LAB_001a760f;
          }
          pbVar1 = in + sVar28;
          sVar28 = sVar28 + 1;
          uVar13 = uVar32 << 8;
          uVar12 = (uint)*pbVar1 | uVar31 << 8;
        }
        uVar2 = *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6180);
        uVar32 = (uVar13 >> 0xb) * (uint)uVar2;
        uVar31 = uVar12 - uVar32;
        if (uVar12 < uVar32) {
          *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6180) = (short)(0x800 - uVar2 >> 5) + uVar2;
          lVar30 = (uint)(STATE_SHORTREP_LIT < lVar30) * 3 + STATE_LIT_MATCH;
          uVar24 = 1;
          local_dc = (uint)uVar27;
          local_ac = uVar33;
switchD_001a4aa6_caseD_14:
          uVar33 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x14;
              uVar31 = uVar12;
              goto LAB_001a7605;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar12 = (uint)*pbVar1 | uVar12 << 8;
            uVar33 = uVar32 << 8;
          }
          uVar2 = *(ushort *)((long)coder_ptr + 0x6664);
          uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
          uVar31 = uVar12 - uVar32;
          if (uVar12 < uVar32) {
            *(ushort *)((long)coder_ptr + 0x6664) = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_001a4aa6_caseD_15:
            uVar31 = uVar32;
            uVar33 = uVar12;
            if (uVar32 < 0x1000000) {
              if (sVar28 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x15;
                uVar31 = uVar12;
                goto LAB_001a7605;
              }
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar31 = uVar32 << 8;
              uVar33 = (uint)*pbVar1 | uVar12 << 8;
            }
            puVar26 = (ushort *)((long)coder_ptr + uVar24 * 2 + local_d8 * 0x10 + 0x6668);
            uVar2 = *puVar26;
            uVar32 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar13 = (int)uVar24 * 2;
            uVar12 = uVar33 - uVar32;
            if (uVar33 < uVar32) {
              *puVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar12 = uVar33;
            }
            else {
              uVar32 = uVar31 - uVar32;
              *puVar26 = uVar2 - (uVar2 >> 5);
              uVar13 = uVar13 | 1;
            }
            uVar24 = (ulong)uVar13;
switchD_001a4aa6_caseD_16:
            uVar31 = uVar32;
            uVar33 = uVar12;
            if (uVar32 < 0x1000000) {
              if (sVar28 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x16;
                uVar31 = uVar12;
                goto LAB_001a7605;
              }
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar31 = uVar32 << 8;
              uVar33 = (uint)*pbVar1 | uVar12 << 8;
            }
            puVar26 = (ushort *)((long)coder_ptr + uVar24 * 2 + local_d8 * 0x10 + 0x6668);
            uVar2 = *puVar26;
            uVar32 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar13 = (int)uVar24 * 2;
            uVar12 = uVar33 - uVar32;
            if (uVar33 < uVar32) {
              *puVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar12 = uVar33;
            }
            else {
              uVar32 = uVar31 - uVar32;
              *puVar26 = uVar2 - (uVar2 >> 5);
              uVar13 = uVar13 | 1;
            }
            uVar24 = (ulong)uVar13;
switchD_001a4aa6_caseD_17:
            uVar33 = uVar12;
            if (uVar32 < 0x1000000) {
              if (sVar28 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x17;
                uVar31 = uVar12;
                goto LAB_001a7605;
              }
              uVar32 = uVar32 << 8;
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar33 = (uint)*pbVar1 | uVar12 << 8;
            }
            puVar26 = (ushort *)((long)coder_ptr + uVar24 * 2 + local_d8 * 0x10 + 0x6668);
            uVar2 = *puVar26;
            uVar13 = (uVar32 >> 0xb) * (uint)uVar2;
            uVar31 = (int)uVar24 * 2;
            uVar12 = uVar33 - uVar13;
            if (uVar33 < uVar13) {
              *puVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar12 = uVar33;
            }
            else {
              uVar13 = uVar32 - uVar13;
              *puVar26 = uVar2 - (uVar2 >> 5);
              uVar31 = uVar31 | 1;
            }
            uVar31 = uVar31 - 6;
            uVar32 = uVar13;
          }
          else {
            uVar32 = uVar33 - uVar32;
            *(ushort *)((long)coder_ptr + 0x6664) = uVar2 - (uVar2 >> 5);
switchD_001a4aa6_caseD_18:
            uVar33 = uVar32;
            uVar12 = uVar31;
            if (uVar32 < 0x1000000) {
              if (sVar28 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x18;
                goto LAB_001a7605;
              }
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar33 = uVar32 << 8;
              uVar12 = (uint)*pbVar1 | uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)coder_ptr + 0x6666);
            uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
            uVar31 = uVar12 - uVar32;
            if (uVar12 < uVar32) {
              *(ushort *)((long)coder_ptr + 0x6666) = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_001a4aa6_caseD_19:
              uVar31 = uVar12;
              uVar33 = uVar32;
              if (uVar32 < 0x1000000) {
                if (sVar28 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x19;
                  goto LAB_001a7605;
                }
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar31 = (uint)*pbVar1 | uVar12 << 8;
                uVar33 = uVar32 << 8;
              }
              puVar26 = (ushort *)((long)coder_ptr + uVar24 * 2 + local_d8 * 0x10 + 0x6768);
              uVar2 = *puVar26;
              uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
              uVar13 = (int)uVar24 * 2;
              uVar12 = uVar31 - uVar32;
              if (uVar31 < uVar32) {
                *puVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar12 = uVar31;
              }
              else {
                uVar32 = uVar33 - uVar32;
                *puVar26 = uVar2 - (uVar2 >> 5);
                uVar13 = uVar13 | 1;
              }
              uVar24 = (ulong)uVar13;
switchD_001a4aa6_caseD_1a:
              uVar31 = uVar12;
              uVar33 = uVar32;
              if (uVar32 < 0x1000000) {
                if (sVar28 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x1a;
                  goto LAB_001a7605;
                }
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar31 = (uint)*pbVar1 | uVar12 << 8;
                uVar33 = uVar32 << 8;
              }
              puVar26 = (ushort *)((long)coder_ptr + uVar24 * 2 + local_d8 * 0x10 + 0x6768);
              uVar2 = *puVar26;
              uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
              uVar13 = (int)uVar24 * 2;
              uVar12 = uVar31 - uVar32;
              if (uVar31 < uVar32) {
                *puVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar12 = uVar31;
              }
              else {
                uVar32 = uVar33 - uVar32;
                *puVar26 = uVar2 - (uVar2 >> 5);
                uVar13 = uVar13 | 1;
              }
              uVar24 = (ulong)uVar13;
switchD_001a4aa6_caseD_1b:
              uVar33 = uVar12;
              if (uVar32 < 0x1000000) {
                if (sVar28 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x1b;
                  uVar31 = uVar12;
                  goto LAB_001a7605;
                }
                uVar32 = uVar32 << 8;
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar33 = (uint)*pbVar1 | uVar12 << 8;
              }
              puVar26 = (ushort *)((long)coder_ptr + uVar24 * 2 + local_d8 * 0x10 + 0x6768);
              uVar2 = *puVar26;
              uVar13 = (uVar32 >> 0xb) * (uint)uVar2;
              uVar31 = (int)uVar24 * 2;
              uVar12 = uVar33 - uVar13;
              if (uVar33 < uVar13) {
                *puVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar12 = uVar33;
              }
              else {
                uVar13 = uVar32 - uVar13;
                *puVar26 = uVar2 - (uVar2 >> 5);
                uVar31 = uVar31 | 1;
              }
              uVar31 = uVar31 + 2;
              uVar32 = uVar13;
            }
            else {
              uVar32 = uVar33 - uVar32;
              *(ushort *)((long)coder_ptr + 0x6666) = uVar2 - (uVar2 >> 5);
              uVar22 = uVar24;
switchD_001a4aa6_caseD_1c:
              uVar33 = uVar32;
              if (uVar32 < 0x1000000) {
                if (sVar28 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x1c;
                  uVar24 = uVar22;
                  goto LAB_001a7605;
                }
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar31 = (uint)*pbVar1 | uVar31 << 8;
                uVar33 = uVar32 << 8;
              }
              uVar2 = *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6868);
              uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
              uVar13 = (int)uVar22 * 2;
              uVar24 = (ulong)uVar13;
              uVar12 = uVar31 - uVar32;
              if (uVar31 < uVar32) {
                *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6868) =
                     (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar12 = uVar31;
              }
              else {
                uVar32 = uVar33 - uVar32;
                *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6868) = uVar2 - (uVar2 >> 5);
                uVar24 = (ulong)(uVar13 | 1);
              }
switchD_001a4aa6_caseD_1d:
              uVar33 = uVar32;
              if (uVar32 < 0x1000000) {
                if (sVar28 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x1d;
                  uVar31 = uVar12;
                  goto LAB_001a7605;
                }
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar12 = (uint)*pbVar1 | uVar12 << 8;
                uVar33 = uVar32 << 8;
              }
              uVar2 = *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6868);
              uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
              uVar13 = (int)uVar24 * 2;
              uVar22 = (ulong)uVar13;
              uVar31 = uVar12 - uVar32;
              if (uVar12 < uVar32) {
                *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6868) =
                     (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar31 = uVar12;
              }
              else {
                uVar32 = uVar33 - uVar32;
                *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6868) = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar13 | 1);
              }
switchD_001a4aa6_caseD_1e:
              uVar33 = uVar32;
              if (uVar32 < 0x1000000) {
                if (sVar28 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x1e;
                  uVar24 = uVar22;
                  goto LAB_001a7605;
                }
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar31 = (uint)*pbVar1 | uVar31 << 8;
                uVar33 = uVar32 << 8;
              }
              uVar2 = *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6868);
              uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
              uVar13 = (int)uVar22 * 2;
              uVar24 = (ulong)uVar13;
              uVar12 = uVar31 - uVar32;
              if (uVar31 < uVar32) {
                *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6868) =
                     (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar12 = uVar31;
              }
              else {
                uVar32 = uVar33 - uVar32;
                *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6868) = uVar2 - (uVar2 >> 5);
                uVar24 = (ulong)(uVar13 | 1);
              }
switchD_001a4aa6_caseD_1f:
              uVar33 = uVar32;
              if (uVar32 < 0x1000000) {
                if (sVar28 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x1f;
                  uVar31 = uVar12;
                  goto LAB_001a7605;
                }
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar12 = (uint)*pbVar1 | uVar12 << 8;
                uVar33 = uVar32 << 8;
              }
              uVar2 = *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6868);
              uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
              uVar13 = (int)uVar24 * 2;
              uVar22 = (ulong)uVar13;
              uVar31 = uVar12 - uVar32;
              if (uVar12 < uVar32) {
                *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6868) =
                     (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar31 = uVar12;
              }
              else {
                uVar32 = uVar33 - uVar32;
                *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6868) = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar13 | 1);
              }
switchD_001a4aa6_caseD_20:
              uVar33 = uVar32;
              if (uVar32 < 0x1000000) {
                if (sVar28 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x20;
                  uVar24 = uVar22;
                  goto LAB_001a7605;
                }
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar31 = (uint)*pbVar1 | uVar31 << 8;
                uVar33 = uVar32 << 8;
              }
              uVar2 = *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6868);
              uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
              uVar13 = (int)uVar22 * 2;
              uVar24 = (ulong)uVar13;
              uVar12 = uVar31 - uVar32;
              if (uVar31 < uVar32) {
                *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6868) =
                     (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar12 = uVar31;
              }
              else {
                uVar32 = uVar33 - uVar32;
                *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6868) = uVar2 - (uVar2 >> 5);
                uVar24 = (ulong)(uVar13 | 1);
              }
switchD_001a4aa6_caseD_21:
              uVar33 = uVar32;
              if (uVar32 < 0x1000000) {
                if (sVar28 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x21;
                  uVar31 = uVar12;
                  goto LAB_001a7605;
                }
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar12 = (uint)*pbVar1 | uVar12 << 8;
                uVar33 = uVar32 << 8;
              }
              uVar2 = *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6868);
              uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
              uVar13 = (int)uVar24 * 2;
              uVar22 = (ulong)uVar13;
              uVar31 = uVar12 - uVar32;
              if (uVar12 < uVar32) {
                *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6868) =
                     (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar31 = uVar12;
              }
              else {
                uVar32 = uVar33 - uVar32;
                *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6868) = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar13 | 1);
              }
switchD_001a4aa6_caseD_22:
              uVar12 = uVar32;
              if (uVar32 < 0x1000000) {
                if (sVar28 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x22;
                  uVar24 = uVar22;
                  goto LAB_001a7605;
                }
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar31 = (uint)*pbVar1 | uVar31 << 8;
                uVar12 = uVar32 << 8;
              }
              uVar2 = *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6868);
              uVar32 = (uVar12 >> 0xb) * (uint)uVar2;
              uVar13 = (int)uVar22 * 2;
              uVar24 = (ulong)uVar13;
              uVar33 = uVar31 - uVar32;
              if (uVar31 < uVar32) {
                *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6868) =
                     (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar33 = uVar31;
              }
              else {
                uVar32 = uVar12 - uVar32;
                *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6868) = uVar2 - (uVar2 >> 5);
                uVar24 = (ulong)(uVar13 | 1);
              }
switchD_001a4aa6_caseD_23:
              if (uVar32 < 0x1000000) {
                if (sVar28 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x23;
                  uVar31 = uVar33;
                  goto LAB_001a7605;
                }
                uVar32 = uVar32 << 8;
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar33 = (uint)*pbVar1 | uVar33 << 8;
              }
              uVar2 = *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6868);
              uVar13 = (uVar32 >> 0xb) * (uint)uVar2;
              uVar31 = (int)uVar24 * 2;
              uVar12 = uVar33 - uVar13;
              if (uVar33 < uVar13) {
                *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6868) =
                     (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar12 = uVar33;
              }
              else {
                uVar13 = uVar32 - uVar13;
                *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6868) = uVar2 - (uVar2 >> 5);
                uVar31 = uVar31 | 1;
              }
              uVar31 = uVar31 - 0xee;
              uVar32 = uVar13;
            }
          }
          uVar17 = (ulong)uVar31;
          uVar24 = 3;
          if (uVar31 < 6) {
            uVar24 = (ulong)(uVar31 - 2);
          }
          pvVar34 = (void *)((long)coder_ptr + uVar24 * 0x80 + 0x6360);
          uVar22 = 1;
switchD_001a4aa6_caseD_24:
          uVar33 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x24;
              uVar24 = uVar22;
              uVar31 = uVar12;
              goto LAB_001a7605;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar12 = (uint)*pbVar1 | uVar12 << 8;
            uVar33 = uVar32 << 8;
          }
          uVar2 = *(ushort *)((long)pvVar34 + uVar22 * 2);
          uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
          uVar13 = (int)uVar22 * 2;
          uVar24 = (ulong)uVar13;
          uVar31 = uVar12 - uVar32;
          if (uVar12 < uVar32) {
            *(ushort *)((long)pvVar34 + uVar22 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar31 = uVar12;
          }
          else {
            uVar32 = uVar33 - uVar32;
            *(ushort *)((long)pvVar34 + uVar22 * 2) = uVar2 - (uVar2 >> 5);
            uVar24 = (ulong)(uVar13 | 1);
          }
switchD_001a4aa6_caseD_25:
          uVar33 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x25;
              goto LAB_001a7605;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar31 = (uint)*pbVar1 | uVar31 << 8;
            uVar33 = uVar32 << 8;
          }
          uVar2 = *(ushort *)((long)pvVar34 + uVar24 * 2);
          uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
          uVar13 = (int)uVar24 * 2;
          uVar22 = (ulong)uVar13;
          uVar12 = uVar31 - uVar32;
          if (uVar31 < uVar32) {
            *(ushort *)((long)pvVar34 + uVar24 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar12 = uVar31;
          }
          else {
            uVar32 = uVar33 - uVar32;
            *(ushort *)((long)pvVar34 + uVar24 * 2) = uVar2 - (uVar2 >> 5);
            uVar22 = (ulong)(uVar13 | 1);
          }
switchD_001a4aa6_caseD_26:
          uVar33 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x26;
              uVar24 = uVar22;
              uVar31 = uVar12;
              goto LAB_001a7605;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar12 = (uint)*pbVar1 | uVar12 << 8;
            uVar33 = uVar32 << 8;
          }
          uVar2 = *(ushort *)((long)pvVar34 + uVar22 * 2);
          uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
          uVar13 = (int)uVar22 * 2;
          uVar24 = (ulong)uVar13;
          uVar31 = uVar12 - uVar32;
          if (uVar12 < uVar32) {
            *(ushort *)((long)pvVar34 + uVar22 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar31 = uVar12;
          }
          else {
            uVar32 = uVar33 - uVar32;
            *(ushort *)((long)pvVar34 + uVar22 * 2) = uVar2 - (uVar2 >> 5);
            uVar24 = (ulong)(uVar13 | 1);
          }
switchD_001a4aa6_caseD_27:
          uVar33 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x27;
              goto LAB_001a7605;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar31 = (uint)*pbVar1 | uVar31 << 8;
            uVar33 = uVar32 << 8;
          }
          uVar2 = *(ushort *)((long)pvVar34 + uVar24 * 2);
          uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
          uVar13 = (int)uVar24 * 2;
          uVar22 = (ulong)uVar13;
          uVar12 = uVar31 - uVar32;
          if (uVar31 < uVar32) {
            *(ushort *)((long)pvVar34 + uVar24 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar12 = uVar31;
          }
          else {
            uVar32 = uVar33 - uVar32;
            *(ushort *)((long)pvVar34 + uVar24 * 2) = uVar2 - (uVar2 >> 5);
            uVar22 = (ulong)(uVar13 | 1);
          }
switchD_001a4aa6_caseD_28:
          uVar33 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x28;
              uVar24 = uVar22;
              uVar31 = uVar12;
              goto LAB_001a7605;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar12 = (uint)*pbVar1 | uVar12 << 8;
            uVar33 = uVar32 << 8;
          }
          uVar2 = *(ushort *)((long)pvVar34 + uVar22 * 2);
          uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
          uVar13 = (int)uVar22 * 2;
          uVar24 = (ulong)uVar13;
          uVar31 = uVar12 - uVar32;
          if (uVar12 < uVar32) {
            *(ushort *)((long)pvVar34 + uVar22 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar31 = uVar12;
          }
          else {
            uVar32 = uVar33 - uVar32;
            *(ushort *)((long)pvVar34 + uVar22 * 2) = uVar2 - (uVar2 >> 5);
            uVar24 = (ulong)(uVar13 | 1);
          }
switchD_001a4aa6_caseD_29:
          uVar33 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x29;
              goto LAB_001a7605;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar31 = (uint)*pbVar1 | uVar31 << 8;
            uVar33 = uVar32 << 8;
          }
          uVar2 = *(ushort *)((long)pvVar34 + uVar24 * 2);
          uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
          uVar13 = (int)uVar24 * 2;
          uVar12 = uVar31 - uVar32;
          if (uVar31 < uVar32) {
            *(ushort *)((long)pvVar34 + uVar24 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar12 = uVar31;
          }
          else {
            uVar32 = uVar33 - uVar32;
            *(ushort *)((long)pvVar34 + uVar24 * 2) = uVar2 - (uVar2 >> 5);
            uVar13 = uVar13 | 1;
          }
          uVar31 = uVar13 - 0x40;
          uVar24 = (ulong)uVar31;
          if (0x3f < uVar31) {
            __assert_fail("symbol <= 63",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                          ,0x218,
                          "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                         );
          }
          uVar27 = uVar24;
          if (uVar31 < 4) {
switchD_001a69bf_default:
            if (uVar27 < local_c0) goto LAB_001a7404;
          }
          else {
            uVar18 = (uVar31 >> 1) - 1;
            uVar33 = uVar13 & 1 | 2;
            uVar27 = (ulong)uVar33;
            if (uVar31 < 0xe) {
              if (5 < uVar18) {
                __assert_fail("limit <= 5",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                              ,0x227,
                              "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                             );
              }
              uVar33 = uVar33 << ((byte)uVar18 & 0x1f);
              uVar27 = (ulong)uVar33;
              iVar21 = (uVar33 - uVar13) + 0x3f;
              if (iVar21 < -1) {
                __assert_fail("(int32_t)(rep0 - symbol - 1) >= -1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                              ,0x231,
                              "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                             );
              }
              if (0x52 < iVar21) {
                __assert_fail("(int32_t)(rep0 - symbol - 1) <= 82",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                              ,0x233,
                              "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                             );
              }
              pvVar34 = (void *)((long)coder_ptr + uVar24 * -2 + (ulong)uVar33 * 2 + 0x655e);
              uVar14 = 0;
              uVar24 = 1;
switchD_001a4aa6_caseD_2a:
              uVar22 = uVar24;
              switch(uVar18) {
              case 1:
                goto switchD_001a69bf_caseD_1;
              case 2:
                goto switchD_001a69bf_caseD_2;
              case 3:
                goto switchD_001a69bf_caseD_3;
              case 4:
                break;
              case 5:
                if (uVar14 != 0) {
                  __assert_fail("offset == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                                ,0x242,
                                "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                               );
                }
                uVar18 = uVar12;
                uVar14 = uVar32;
                if (uVar32 < 0x1000000) {
                  if (sVar28 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2a;
                    bVar10 = true;
                    uVar14 = 0;
                    uVar18 = 5;
                    lVar15 = LZMA_OK;
                    goto LAB_001a760f;
                  }
                  pbVar1 = in + sVar28;
                  sVar28 = sVar28 + 1;
                  uVar18 = (uint)*pbVar1 | uVar12 << 8;
                  uVar14 = uVar32 << 8;
                }
                uVar2 = *(ushort *)((long)pvVar34 + uVar24 * 2);
                uVar32 = (uVar14 >> 0xb) * (uint)uVar2;
                uVar31 = (int)uVar24 * 2;
                uVar22 = (ulong)uVar31;
                uVar12 = uVar18 - uVar32;
                if (uVar18 < uVar32) {
                  *(ushort *)((long)pvVar34 + uVar24 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar14 = 1;
                  uVar12 = uVar18;
                }
                else {
                  uVar32 = uVar14 - uVar32;
                  *(ushort *)((long)pvVar34 + uVar24 * 2) = uVar2 - (uVar2 >> 5);
                  uVar22 = (ulong)(uVar31 | 1);
                  uVar27 = (ulong)((int)uVar27 + 1);
                  uVar14 = 1;
                }
                break;
              default:
                goto switchD_001a69bf_default;
              }
              if (0xffffff < uVar32) {
LAB_001a7209:
                uVar2 = *(ushort *)((long)pvVar34 + uVar22 * 2);
                uVar33 = (uVar32 >> 0xb) * (uint)uVar2;
                uVar18 = (int)uVar22 * 2;
                uVar31 = uVar12 - uVar33;
                if (uVar12 < uVar33) {
                  *(ushort *)((long)pvVar34 + uVar22 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar31 = uVar12;
                  uVar32 = uVar33;
                }
                else {
                  uVar32 = uVar32 - uVar33;
                  *(ushort *)((long)pvVar34 + uVar22 * 2) = uVar2 - (uVar2 >> 5);
                  uVar18 = uVar18 | 1;
                  uVar27 = (ulong)(uint)((1 << ((byte)uVar14 & 0x1f)) + (int)uVar27);
                }
                uVar24 = (ulong)uVar18;
                uVar14 = uVar14 + 1;
                uVar12 = uVar31;
switchD_001a69bf_caseD_3:
                if (uVar32 < 0x1000000) {
                  if (sVar28 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2a;
                    uVar18 = 3;
                    goto LAB_001a7d37;
                  }
                  uVar32 = uVar32 << 8;
                  pbVar1 = in + sVar28;
                  sVar28 = sVar28 + 1;
                  uVar12 = (uint)*pbVar1 | uVar12 << 8;
                }
                uVar2 = *(ushort *)((long)pvVar34 + uVar24 * 2);
                uVar33 = (uVar32 >> 0xb) * (uint)uVar2;
                uVar18 = (int)uVar24 * 2;
                uVar31 = uVar12 - uVar33;
                if (uVar12 < uVar33) {
                  *(ushort *)((long)pvVar34 + uVar24 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar31 = uVar12;
                  uVar32 = uVar33;
                }
                else {
                  uVar32 = uVar32 - uVar33;
                  *(ushort *)((long)pvVar34 + uVar24 * 2) = uVar2 - (uVar2 >> 5);
                  uVar18 = uVar18 | 1;
                  uVar27 = (ulong)(uint)((1 << ((byte)uVar14 & 0x1f)) + (int)uVar27);
                }
                uVar24 = (ulong)uVar18;
                uVar14 = uVar14 + 1;
                uVar12 = uVar31;
switchD_001a69bf_caseD_2:
                if (uVar32 < 0x1000000) {
                  if (sVar28 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2a;
                    uVar18 = 2;
                    goto LAB_001a7d37;
                  }
                  uVar32 = uVar32 << 8;
                  pbVar1 = in + sVar28;
                  sVar28 = sVar28 + 1;
                  uVar12 = (uint)*pbVar1 | uVar12 << 8;
                }
                uVar2 = *(ushort *)((long)pvVar34 + uVar24 * 2);
                uVar33 = (uVar32 >> 0xb) * (uint)uVar2;
                uVar18 = (int)uVar24 * 2;
                uVar31 = uVar12 - uVar33;
                if (uVar12 < uVar33) {
                  *(ushort *)((long)pvVar34 + uVar24 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar31 = uVar12;
                  uVar32 = uVar33;
                }
                else {
                  uVar32 = uVar32 - uVar33;
                  *(ushort *)((long)pvVar34 + uVar24 * 2) = uVar2 - (uVar2 >> 5);
                  uVar18 = uVar18 | 1;
                  uVar27 = (ulong)(uint)((1 << ((byte)uVar14 & 0x1f)) + (int)uVar27);
                }
                uVar24 = (ulong)uVar18;
                uVar14 = uVar14 + 1;
                uVar12 = uVar31;
switchD_001a69bf_caseD_1:
                uVar18 = uVar32;
                if (uVar32 < 0x1000000) {
                  if (sVar28 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2a;
                    uVar18 = 1;
                    goto LAB_001a7d37;
                  }
                  pbVar1 = in + sVar28;
                  sVar28 = sVar28 + 1;
                  uVar12 = (uint)*pbVar1 | uVar12 << 8;
                  uVar18 = uVar32 << 8;
                }
                uVar2 = *(ushort *)((long)pvVar34 + uVar24 * 2);
                uVar32 = (uVar18 >> 0xb) * (uint)uVar2;
                uVar31 = uVar12 - uVar32;
                if (uVar12 < uVar32) {
                  *(ushort *)((long)pvVar34 + uVar24 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar31 = uVar12;
                }
                else {
                  uVar32 = uVar18 - uVar32;
                  *(ushort *)((long)pvVar34 + uVar24 * 2) = uVar2 - (uVar2 >> 5);
                  uVar27 = (ulong)(uint)((1 << ((byte)uVar14 & 0x1f)) + (int)uVar27);
                }
                uVar18 = 1;
                uVar12 = uVar31;
                goto switchD_001a69bf_default;
              }
              if (sVar28 != in_size) {
                uVar32 = uVar32 << 8;
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar12 = (uint)*pbVar1 | uVar12 << 8;
                goto LAB_001a7209;
              }
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2a;
              uVar18 = 4;
              uVar24 = uVar22;
LAB_001a7d37:
              lVar15 = LZMA_OK;
              bVar10 = true;
              goto LAB_001a760f;
            }
            if (uVar18 < 6) {
              __assert_fail("limit >= 6",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                            ,0x26b,
                            "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                           );
            }
            uVar18 = (uVar31 >> 1) - 5;
switchD_001a4aa6_caseD_2b:
            do {
              if (uVar32 < 0x1000000) {
                if (sVar28 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2b;
                  uVar31 = uVar12;
                  goto LAB_001a7605;
                }
                uVar32 = uVar32 << 8;
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar12 = uVar12 << 8 | (uint)*pbVar1;
              }
              uVar32 = uVar32 >> 1;
              uVar31 = (int)(uVar12 - uVar32) >> 0x1f;
              uVar33 = uVar31 + (int)uVar27 * 2 + 1;
              uVar27 = (ulong)uVar33;
              uVar12 = (uVar31 & uVar32) + (uVar12 - uVar32);
              uVar18 = uVar18 - 1;
            } while (uVar18 != 0);
            uVar27 = (ulong)(uVar33 * 0x10);
            uVar18 = 0;
            uVar24 = 1;
switchD_001a4aa6_caseD_2c:
            uVar33 = uVar32;
            if (uVar32 < 0x1000000) {
              if (sVar28 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2c;
                uVar31 = uVar12;
                goto LAB_001a7605;
              }
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar12 = (uint)*pbVar1 | uVar12 << 8;
              uVar33 = uVar32 << 8;
            }
            uVar2 = *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6644);
            uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
            uVar13 = (int)uVar24 * 2;
            uVar25 = (ulong)uVar13;
            uVar31 = uVar12 - uVar32;
            if (uVar12 < uVar32) {
              *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6644) =
                   (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar31 = uVar12;
            }
            else {
              uVar32 = uVar33 - uVar32;
              *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6644) = uVar2 - (uVar2 >> 5);
              uVar25 = (ulong)(uVar13 | 1);
              uVar27 = (ulong)((int)uVar27 + 1);
            }
switchD_001a4aa6_caseD_2d:
            uVar33 = uVar32;
            if (uVar32 < 0x1000000) {
              if (sVar28 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2d;
                uVar24 = uVar25;
                goto LAB_001a7605;
              }
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar31 = (uint)*pbVar1 | uVar31 << 8;
              uVar33 = uVar32 << 8;
            }
            uVar2 = *(ushort *)((long)coder_ptr + uVar25 * 2 + 0x6644);
            uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
            uVar13 = (int)uVar25 * 2;
            uVar22 = (ulong)uVar13;
            uVar12 = uVar31 - uVar32;
            if (uVar31 < uVar32) {
              *(ushort *)((long)coder_ptr + uVar25 * 2 + 0x6644) =
                   (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar12 = uVar31;
            }
            else {
              uVar32 = uVar33 - uVar32;
              *(ushort *)((long)coder_ptr + uVar25 * 2 + 0x6644) = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar13 | 1);
              uVar27 = (ulong)((int)uVar27 + 2);
            }
switchD_001a4aa6_caseD_2e:
            uVar33 = uVar32;
            if (uVar32 < 0x1000000) {
              if (sVar28 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2e;
                uVar24 = uVar22;
                uVar31 = uVar12;
                goto LAB_001a7605;
              }
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar12 = (uint)*pbVar1 | uVar12 << 8;
              uVar33 = uVar32 << 8;
            }
            uVar2 = *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6644);
            uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
            uVar13 = (int)uVar22 * 2;
            uVar24 = (ulong)uVar13;
            uVar31 = uVar12 - uVar32;
            if (uVar12 < uVar32) {
              *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6644) =
                   (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar31 = uVar12;
            }
            else {
              uVar32 = uVar33 - uVar32;
              *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6644) = uVar2 - (uVar2 >> 5);
              uVar24 = (ulong)(uVar13 | 1);
              uVar27 = (ulong)((int)uVar27 + 4);
            }
switchD_001a4aa6_caseD_2f:
            uVar33 = uVar32;
            if (uVar32 < 0x1000000) {
              if (sVar28 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2f;
                goto LAB_001a7605;
              }
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar31 = (uint)*pbVar1 | uVar31 << 8;
              uVar33 = uVar32 << 8;
            }
            uVar2 = *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6644);
            uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
            uVar12 = uVar31 - uVar32;
            if (uVar31 < uVar32) {
              *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6644) =
                   (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar12 = uVar31;
            }
            else {
              uVar32 = uVar33 - uVar32;
              *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6644) = uVar2 - (uVar2 >> 5);
              uVar27 = (ulong)((int)uVar27 + 8);
            }
            if ((int)uVar27 != -1) goto switchD_001a69bf_default;
            uVar27 = 0xffffffff;
            if (*(long *)((long)coder_ptr + 0x6e98) == -1) goto switchD_001a4aa6_caseD_30;
          }
          lVar15 = LZMA_DATA_ERROR;
          goto LAB_001a75ee;
        }
        uVar32 = uVar13 - uVar32;
        *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6180) = uVar2 - (uVar2 >> 5);
        local_e0 = uVar33;
        if (local_c0 == 0) {
          lVar15 = LZMA_DATA_ERROR;
          bVar10 = false;
          uVar12 = uVar31;
          goto LAB_001a760f;
        }
switchD_001a4aa6_caseD_31:
        uVar12 = uVar31;
        uVar33 = uVar32;
        if (uVar32 < 0x1000000) {
          if (sVar28 == in_size) {
            *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x31;
            goto LAB_001a7605;
          }
          pbVar1 = in + sVar28;
          sVar28 = sVar28 + 1;
          uVar12 = (uint)*pbVar1 | uVar31 << 8;
          uVar33 = uVar32 << 8;
        }
        uVar22 = (ulong)lVar30;
        uVar2 = *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6198);
        uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
        uVar31 = uVar12 - uVar32;
        if (uVar12 < uVar32) {
          *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6198) = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_001a4aa6_caseD_33:
          uVar13 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x33;
              uVar31 = uVar12;
              goto LAB_001a7605;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar12 = (uint)*pbVar1 | uVar12 << 8;
            uVar13 = uVar32 << 8;
          }
          puVar26 = (ushort *)((long)coder_ptr + local_d8 * 2 + (ulong)lVar30 * 0x20 + 0x61e0);
          uVar2 = *puVar26;
          uVar32 = (uVar13 >> 0xb) * (uint)uVar2;
          if (uVar12 < uVar32) {
            *puVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
            lVar30 = (uint)(STATE_SHORTREP_LIT < lVar30) * 2 + STATE_LIT_SHORTREP;
switchD_001a4aa6_caseD_32:
            uVar22 = local_c8;
            if (local_c8 != uVar20) {
              sVar16 = 0;
              if (local_c8 <= uVar27) {
                sVar16 = sVar9;
              }
              uVar22 = local_c8 + 1;
              __src[local_c8] = __src[sVar16 + ~uVar27 + local_c8];
              if (local_c0 < uVar22) {
                local_c0 = uVar22;
              }
            }
            if (local_c8 != uVar20) goto LAB_001a4af7;
            *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x32;
            lVar15 = LZMA_OK;
            bVar10 = true;
            local_c8 = uVar22;
            goto LAB_001a760f;
          }
          *puVar26 = uVar2 - (uVar2 >> 5);
          uVar31 = (uint)uVar27;
          uVar12 = uVar12 - uVar32;
          uVar33 = local_dc;
          uVar32 = uVar13 - uVar32;
        }
        else {
          uVar32 = uVar33 - uVar32;
          *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6198) = uVar2 - (uVar2 >> 5);
switchD_001a4aa6_caseD_34:
          uVar33 = (uint)uVar27;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x34;
              goto LAB_001a7605;
            }
            uVar32 = uVar32 << 8;
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar31 = (uint)*pbVar1 | uVar31 << 8;
          }
          uVar22 = (ulong)lVar30;
          uVar2 = *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x61b0);
          uVar13 = (uVar32 >> 0xb) * (uint)uVar2;
          uVar12 = uVar31 - uVar13;
          if (uVar31 < uVar13) {
            *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x61b0) = (short)(0x800 - uVar2 >> 5) + uVar2
            ;
            uVar12 = uVar31;
            uVar31 = local_dc;
            uVar32 = uVar13;
          }
          else {
            uVar32 = uVar32 - uVar13;
            *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x61b0) = uVar2 - (uVar2 >> 5);
switchD_001a4aa6_caseD_35:
            uVar31 = local_ac;
            if (uVar32 < 0x1000000) {
              if (sVar28 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x35;
                uVar31 = uVar12;
                goto LAB_001a7605;
              }
              uVar32 = uVar32 << 8;
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar12 = (uint)*pbVar1 | uVar12 << 8;
            }
            uVar24 = (ulong)lVar30;
            uVar2 = *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x61c8);
            uVar13 = (uVar32 >> 0xb) * (uint)uVar2;
            uVar33 = (uint)uVar27;
            if (uVar12 < uVar13) {
              *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x61c8) =
                   (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar31 = local_e0;
              local_e0 = local_dc;
              uVar32 = uVar13;
            }
            else {
              *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x61c8) = uVar2 - (uVar2 >> 5);
              local_ac = local_e0;
              uVar12 = uVar12 - uVar13;
              local_e0 = local_dc;
              uVar32 = uVar32 - uVar13;
            }
          }
        }
        lVar30 = (uint)(STATE_SHORTREP_LIT < lVar30) * 3 + STATE_LIT_LONGREP;
        uVar27 = (ulong)uVar31;
        uVar24 = 1;
        local_dc = uVar33;
switchD_001a4aa6_caseD_36:
        uVar33 = uVar32;
        if (uVar32 < 0x1000000) {
          if (sVar28 == in_size) {
            *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x36;
            uVar31 = uVar12;
            goto LAB_001a7605;
          }
          pbVar1 = in + sVar28;
          sVar28 = sVar28 + 1;
          uVar12 = (uint)*pbVar1 | uVar12 << 8;
          uVar33 = uVar32 << 8;
        }
        uVar2 = *(ushort *)((long)coder_ptr + 0x6a68);
        uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
        uVar31 = uVar12 - uVar32;
        if (uVar12 < uVar32) {
          *(ushort *)((long)coder_ptr + 0x6a68) = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_001a4aa6_caseD_37:
          uVar31 = uVar12;
          uVar33 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x37;
              goto LAB_001a7605;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar31 = (uint)*pbVar1 | uVar12 << 8;
            uVar33 = uVar32 << 8;
          }
          puVar26 = (ushort *)((long)coder_ptr + uVar24 * 2 + local_d8 * 0x10 + 0x6a6c);
          uVar2 = *puVar26;
          uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
          uVar13 = (int)uVar24 * 2;
          uVar12 = uVar31 - uVar32;
          if (uVar31 < uVar32) {
            *puVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar12 = uVar31;
          }
          else {
            uVar32 = uVar33 - uVar32;
            *puVar26 = uVar2 - (uVar2 >> 5);
            uVar13 = uVar13 | 1;
          }
          uVar24 = (ulong)uVar13;
switchD_001a4aa6_caseD_38:
          uVar31 = uVar12;
          uVar33 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x38;
              goto LAB_001a7605;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar31 = (uint)*pbVar1 | uVar12 << 8;
            uVar33 = uVar32 << 8;
          }
          puVar26 = (ushort *)((long)coder_ptr + uVar24 * 2 + local_d8 * 0x10 + 0x6a6c);
          uVar2 = *puVar26;
          uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
          uVar13 = (int)uVar24 * 2;
          uVar12 = uVar31 - uVar32;
          if (uVar31 < uVar32) {
            *puVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar12 = uVar31;
          }
          else {
            uVar32 = uVar33 - uVar32;
            *puVar26 = uVar2 - (uVar2 >> 5);
            uVar13 = uVar13 | 1;
          }
          uVar24 = (ulong)uVar13;
switchD_001a4aa6_caseD_39:
          uVar31 = uVar12;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x39;
              goto LAB_001a7605;
            }
            uVar32 = uVar32 << 8;
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar31 = (uint)*pbVar1 | uVar12 << 8;
          }
          puVar26 = (ushort *)((long)coder_ptr + uVar24 * 2 + local_d8 * 0x10 + 0x6a6c);
          uVar2 = *puVar26;
          uVar13 = (uVar32 >> 0xb) * (uint)uVar2;
          uVar33 = (int)uVar24 * 2;
          uVar12 = uVar31 - uVar13;
          if (uVar31 < uVar13) {
            *puVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar12 = uVar31;
          }
          else {
            uVar13 = uVar32 - uVar13;
            *puVar26 = uVar2 - (uVar2 >> 5);
            uVar33 = uVar33 | 1;
          }
          uVar31 = uVar33 - 6;
          uVar32 = uVar13;
LAB_001a6935:
          uVar17 = (ulong)uVar31;
          uVar24 = (ulong)uVar33;
        }
        else {
          uVar32 = uVar33 - uVar32;
          *(ushort *)((long)coder_ptr + 0x6a68) = uVar2 - (uVar2 >> 5);
switchD_001a4aa6_caseD_3a:
          uVar12 = uVar31;
          uVar33 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x3a;
              goto LAB_001a7605;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar12 = (uint)*pbVar1 | uVar31 << 8;
            uVar33 = uVar32 << 8;
          }
          uVar2 = *(ushort *)((long)coder_ptr + 0x6a6a);
          uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
          uVar31 = uVar12 - uVar32;
          if (uVar12 < uVar32) {
            *(ushort *)((long)coder_ptr + 0x6a6a) = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_001a4aa6_caseD_3b:
            uVar31 = uVar12;
            uVar33 = uVar32;
            if (uVar32 < 0x1000000) {
              if (sVar28 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x3b;
                goto LAB_001a7605;
              }
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar31 = (uint)*pbVar1 | uVar12 << 8;
              uVar33 = uVar32 << 8;
            }
            puVar26 = (ushort *)((long)coder_ptr + uVar24 * 2 + local_d8 * 0x10 + 0x6b6c);
            uVar2 = *puVar26;
            uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
            uVar13 = (int)uVar24 * 2;
            uVar12 = uVar31 - uVar32;
            if (uVar31 < uVar32) {
              *puVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar12 = uVar31;
            }
            else {
              uVar32 = uVar33 - uVar32;
              *puVar26 = uVar2 - (uVar2 >> 5);
              uVar13 = uVar13 | 1;
            }
            uVar24 = (ulong)uVar13;
switchD_001a4aa6_caseD_3c:
            uVar31 = uVar12;
            uVar33 = uVar32;
            if (uVar32 < 0x1000000) {
              if (sVar28 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x3c;
                goto LAB_001a7605;
              }
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar31 = (uint)*pbVar1 | uVar12 << 8;
              uVar33 = uVar32 << 8;
            }
            puVar26 = (ushort *)((long)coder_ptr + uVar24 * 2 + local_d8 * 0x10 + 0x6b6c);
            uVar2 = *puVar26;
            uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
            uVar13 = (int)uVar24 * 2;
            uVar12 = uVar31 - uVar32;
            if (uVar31 < uVar32) {
              *puVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar12 = uVar31;
            }
            else {
              uVar32 = uVar33 - uVar32;
              *puVar26 = uVar2 - (uVar2 >> 5);
              uVar13 = uVar13 | 1;
            }
            uVar24 = (ulong)uVar13;
switchD_001a4aa6_caseD_3d:
            uVar31 = uVar12;
            if (uVar32 < 0x1000000) {
              if (sVar28 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x3d;
                goto LAB_001a7605;
              }
              uVar32 = uVar32 << 8;
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar31 = (uint)*pbVar1 | uVar12 << 8;
            }
            puVar26 = (ushort *)((long)coder_ptr + uVar24 * 2 + local_d8 * 0x10 + 0x6b6c);
            uVar2 = *puVar26;
            uVar13 = (uVar32 >> 0xb) * (uint)uVar2;
            uVar33 = (int)uVar24 * 2;
            uVar12 = uVar31 - uVar13;
            if (uVar31 < uVar13) {
              *puVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar12 = uVar31;
              uVar32 = uVar13;
            }
            else {
              uVar32 = uVar32 - uVar13;
              *puVar26 = uVar2 - (uVar2 >> 5);
              uVar33 = uVar33 | 1;
            }
            uVar31 = uVar33 + 2;
            goto LAB_001a6935;
          }
          uVar32 = uVar33 - uVar32;
          *(ushort *)((long)coder_ptr + 0x6a6a) = uVar2 - (uVar2 >> 5);
          uVar22 = uVar24;
switchD_001a4aa6_caseD_3e:
          uVar33 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x3e;
              uVar24 = uVar22;
              goto LAB_001a7605;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar31 = (uint)*pbVar1 | uVar31 << 8;
            uVar33 = uVar32 << 8;
          }
          uVar2 = *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6c6c);
          uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
          uVar13 = (int)uVar22 * 2;
          uVar24 = (ulong)uVar13;
          uVar12 = uVar31 - uVar32;
          if (uVar31 < uVar32) {
            *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6c6c) = (short)(0x800 - uVar2 >> 5) + uVar2
            ;
            uVar12 = uVar31;
          }
          else {
            uVar32 = uVar33 - uVar32;
            *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6c6c) = uVar2 - (uVar2 >> 5);
            uVar24 = (ulong)(uVar13 | 1);
          }
switchD_001a4aa6_caseD_3f:
          uVar33 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x3f;
              uVar31 = uVar12;
              goto LAB_001a7605;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar12 = (uint)*pbVar1 | uVar12 << 8;
            uVar33 = uVar32 << 8;
          }
          uVar2 = *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6c6c);
          uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
          uVar13 = (int)uVar24 * 2;
          uVar22 = (ulong)uVar13;
          uVar31 = uVar12 - uVar32;
          if (uVar12 < uVar32) {
            *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6c6c) = (short)(0x800 - uVar2 >> 5) + uVar2
            ;
            uVar31 = uVar12;
          }
          else {
            uVar32 = uVar33 - uVar32;
            *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6c6c) = uVar2 - (uVar2 >> 5);
            uVar22 = (ulong)(uVar13 | 1);
          }
switchD_001a4aa6_caseD_40:
          uVar33 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x40;
              uVar24 = uVar22;
              goto LAB_001a7605;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar31 = (uint)*pbVar1 | uVar31 << 8;
            uVar33 = uVar32 << 8;
          }
          uVar2 = *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6c6c);
          uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
          uVar13 = (int)uVar22 * 2;
          uVar24 = (ulong)uVar13;
          uVar12 = uVar31 - uVar32;
          if (uVar31 < uVar32) {
            *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6c6c) = (short)(0x800 - uVar2 >> 5) + uVar2
            ;
            uVar12 = uVar31;
          }
          else {
            uVar32 = uVar33 - uVar32;
            *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6c6c) = uVar2 - (uVar2 >> 5);
            uVar24 = (ulong)(uVar13 | 1);
          }
switchD_001a4aa6_caseD_41:
          uVar33 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x41;
              uVar31 = uVar12;
              goto LAB_001a7605;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar12 = (uint)*pbVar1 | uVar12 << 8;
            uVar33 = uVar32 << 8;
          }
          uVar2 = *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6c6c);
          uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
          uVar13 = (int)uVar24 * 2;
          uVar22 = (ulong)uVar13;
          uVar31 = uVar12 - uVar32;
          if (uVar12 < uVar32) {
            *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6c6c) = (short)(0x800 - uVar2 >> 5) + uVar2
            ;
            uVar31 = uVar12;
          }
          else {
            uVar32 = uVar33 - uVar32;
            *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6c6c) = uVar2 - (uVar2 >> 5);
            uVar22 = (ulong)(uVar13 | 1);
          }
switchD_001a4aa6_caseD_42:
          uVar33 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x42;
              uVar24 = uVar22;
              goto LAB_001a7605;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar31 = (uint)*pbVar1 | uVar31 << 8;
            uVar33 = uVar32 << 8;
          }
          uVar2 = *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6c6c);
          uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
          uVar13 = (int)uVar22 * 2;
          uVar24 = (ulong)uVar13;
          uVar12 = uVar31 - uVar32;
          if (uVar31 < uVar32) {
            *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6c6c) = (short)(0x800 - uVar2 >> 5) + uVar2
            ;
            uVar12 = uVar31;
          }
          else {
            uVar32 = uVar33 - uVar32;
            *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6c6c) = uVar2 - (uVar2 >> 5);
            uVar24 = (ulong)(uVar13 | 1);
          }
switchD_001a4aa6_caseD_43:
          uVar33 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x43;
              uVar31 = uVar12;
              goto LAB_001a7605;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar12 = (uint)*pbVar1 | uVar12 << 8;
            uVar33 = uVar32 << 8;
          }
          uVar2 = *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6c6c);
          uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
          uVar13 = (int)uVar24 * 2;
          uVar22 = (ulong)uVar13;
          uVar31 = uVar12 - uVar32;
          if (uVar12 < uVar32) {
            *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6c6c) = (short)(0x800 - uVar2 >> 5) + uVar2
            ;
            uVar31 = uVar12;
          }
          else {
            uVar32 = uVar33 - uVar32;
            *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6c6c) = uVar2 - (uVar2 >> 5);
            uVar22 = (ulong)(uVar13 | 1);
          }
switchD_001a4aa6_caseD_44:
          uVar12 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x44;
              uVar24 = uVar22;
              goto LAB_001a7605;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar31 = (uint)*pbVar1 | uVar31 << 8;
            uVar12 = uVar32 << 8;
          }
          uVar2 = *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6c6c);
          uVar32 = (uVar12 >> 0xb) * (uint)uVar2;
          uVar13 = (int)uVar22 * 2;
          uVar24 = (ulong)uVar13;
          uVar33 = uVar31 - uVar32;
          if (uVar31 < uVar32) {
            *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6c6c) = (short)(0x800 - uVar2 >> 5) + uVar2
            ;
            uVar33 = uVar31;
          }
          else {
            uVar32 = uVar12 - uVar32;
            *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6c6c) = uVar2 - (uVar2 >> 5);
            uVar24 = (ulong)(uVar13 | 1);
          }
switchD_001a4aa6_caseD_45:
          if (uVar32 < 0x1000000) {
            if (sVar28 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x45;
              uVar31 = uVar33;
              goto LAB_001a7605;
            }
            uVar32 = uVar32 << 8;
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar33 = (uint)*pbVar1 | uVar33 << 8;
          }
          uVar2 = *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6c6c);
          uVar13 = (uVar32 >> 0xb) * (uint)uVar2;
          uVar31 = (int)uVar24 * 2;
          uVar12 = uVar33 - uVar13;
          if (uVar33 < uVar13) {
            *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6c6c) = (short)(0x800 - uVar2 >> 5) + uVar2
            ;
            uVar12 = uVar33;
            uVar32 = uVar13;
          }
          else {
            uVar32 = uVar32 - uVar13;
            *(ushort *)((long)coder_ptr + uVar24 * 2 + 0x6c6c) = uVar2 - (uVar2 >> 5);
            uVar31 = uVar31 | 1;
          }
          uVar24 = (ulong)uVar31;
          uVar17 = (ulong)(uVar31 - 0xee);
        }
LAB_001a7404:
        if ((uint)uVar17 < 2) {
          __assert_fail("len >= MATCH_LEN_MIN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                        ,0x311,
                        "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                       );
        }
        if (0x111 < (uint)uVar17) {
          __assert_fail("len <= MATCH_LEN_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                        ,0x312,
                        "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                       );
        }
switchD_001a4aa6_caseD_46:
        uVar25 = uVar20 - local_c8 & 0xffffffff;
        if (uVar17 <= uVar20 - local_c8) {
          uVar25 = uVar17;
        }
        uVar33 = (uint)uVar25;
        uVar31 = (int)uVar17 - uVar33;
        uVar17 = (ulong)uVar31;
        if ((uint)uVar27 < uVar33) {
          uVar22 = local_c8;
          do {
            sVar16 = sVar9;
            if (uVar27 < uVar22) {
              sVar16 = 0;
            }
            __src[uVar22] = __src[uVar22 + sVar16 + ~uVar27];
            uVar22 = uVar22 + 1;
            uVar33 = (int)uVar25 - 1;
            uVar25 = (ulong)uVar33;
          } while (uVar33 != 0);
        }
        else if (uVar27 < local_c8) {
          memcpy(__src + local_c8,__src + local_c8 + ~uVar27,uVar25);
          uVar22 = local_c8 + uVar25;
        }
        else {
          if (local_c0 != sVar9) {
            __assert_fail("dict->full == dict->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_decoder.h"
                          ,0x9d,"_Bool dict_repeat(lzma_dict *, uint32_t, uint32_t *)");
          }
          iVar21 = ~(uint)uVar27 + (int)local_c8;
          uVar13 = -iVar21;
          if (uVar13 < uVar33) {
            memmove(__src + local_c8,__src + (uint)((int)sVar9 + iVar21),(ulong)uVar13);
            local_c8 = local_c8 + uVar13;
            uVar25 = (ulong)(uVar33 + iVar21);
            memcpy(__src + local_c8,__src,uVar25);
          }
          else {
            memmove(__src + local_c8,__src + (uint)((int)sVar9 + iVar21),uVar25);
          }
          uVar22 = local_c8 + uVar25;
        }
        if (local_c0 <= uVar22) {
          local_c0 = uVar22;
        }
        if (uVar31 != 0) {
          *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x46;
          lVar15 = LZMA_OK;
          bVar10 = true;
          local_c8 = uVar22;
          goto LAB_001a760f;
        }
      }
LAB_001a4af7:
      local_d8 = (ulong)(uVar4 & (uint)uVar22);
      local_c8 = uVar22;
      goto switchD_001a4aa6_caseD_0;
    case 2:
      goto switchD_001a4aa6_caseD_2;
    case 3:
      goto switchD_001a4aa6_caseD_3;
    case 4:
      goto switchD_001a4aa6_caseD_4;
    case 5:
      goto switchD_001a4aa6_caseD_5;
    case 6:
      goto switchD_001a4aa6_caseD_6;
    case 7:
      goto switchD_001a4aa6_caseD_7;
    case 8:
      goto switchD_001a4aa6_caseD_8;
    case 9:
      goto switchD_001a4aa6_caseD_9;
    case 10:
      goto switchD_001a4aa6_caseD_a;
    case 0xb:
      goto switchD_001a4aa6_caseD_b;
    case 0xc:
      goto switchD_001a4aa6_caseD_c;
    case 0xd:
      goto switchD_001a4aa6_caseD_d;
    case 0xe:
      goto switchD_001a4aa6_caseD_e;
    case 0xf:
      goto switchD_001a4aa6_caseD_f;
    case 0x10:
      goto switchD_001a4aa6_caseD_10;
    case 0x11:
      goto switchD_001a4aa6_caseD_11;
    case 0x12:
      goto switchD_001a4aa6_caseD_12;
    case 0x13:
      goto switchD_001a4aa6_caseD_13;
    case 0x14:
      goto switchD_001a4aa6_caseD_14;
    case 0x15:
      goto switchD_001a4aa6_caseD_15;
    case 0x16:
      goto switchD_001a4aa6_caseD_16;
    case 0x17:
      goto switchD_001a4aa6_caseD_17;
    case 0x18:
      goto switchD_001a4aa6_caseD_18;
    case 0x19:
      goto switchD_001a4aa6_caseD_19;
    case 0x1a:
      goto switchD_001a4aa6_caseD_1a;
    case 0x1b:
      goto switchD_001a4aa6_caseD_1b;
    case 0x1c:
      goto switchD_001a4aa6_caseD_1c;
    case 0x1d:
      goto switchD_001a4aa6_caseD_1d;
    case 0x1e:
      goto switchD_001a4aa6_caseD_1e;
    case 0x1f:
      goto switchD_001a4aa6_caseD_1f;
    case 0x20:
      goto switchD_001a4aa6_caseD_20;
    case 0x21:
      goto switchD_001a4aa6_caseD_21;
    case 0x22:
      goto switchD_001a4aa6_caseD_22;
    case 0x23:
      goto switchD_001a4aa6_caseD_23;
    case 0x24:
      goto switchD_001a4aa6_caseD_24;
    case 0x25:
      goto switchD_001a4aa6_caseD_25;
    case 0x26:
      goto switchD_001a4aa6_caseD_26;
    case 0x27:
      goto switchD_001a4aa6_caseD_27;
    case 0x28:
      goto switchD_001a4aa6_caseD_28;
    case 0x29:
      goto switchD_001a4aa6_caseD_29;
    case 0x2a:
      goto switchD_001a4aa6_caseD_2a;
    case 0x2b:
      goto switchD_001a4aa6_caseD_2b;
    case 0x2c:
      goto switchD_001a4aa6_caseD_2c;
    case 0x2d:
      goto switchD_001a4aa6_caseD_2d;
    case 0x2e:
      goto switchD_001a4aa6_caseD_2e;
    case 0x2f:
      goto switchD_001a4aa6_caseD_2f;
    case 0x30:
      goto switchD_001a4aa6_caseD_30;
    case 0x31:
      goto switchD_001a4aa6_caseD_31;
    case 0x32:
      goto switchD_001a4aa6_caseD_32;
    case 0x33:
      goto switchD_001a4aa6_caseD_33;
    case 0x34:
      goto switchD_001a4aa6_caseD_34;
    case 0x35:
      goto switchD_001a4aa6_caseD_35;
    case 0x36:
      goto switchD_001a4aa6_caseD_36;
    case 0x37:
      goto switchD_001a4aa6_caseD_37;
    case 0x38:
      goto switchD_001a4aa6_caseD_38;
    case 0x39:
      goto switchD_001a4aa6_caseD_39;
    case 0x3a:
      goto switchD_001a4aa6_caseD_3a;
    case 0x3b:
      goto switchD_001a4aa6_caseD_3b;
    case 0x3c:
      goto switchD_001a4aa6_caseD_3c;
    case 0x3d:
      goto switchD_001a4aa6_caseD_3d;
    case 0x3e:
      goto switchD_001a4aa6_caseD_3e;
    case 0x3f:
      goto switchD_001a4aa6_caseD_3f;
    case 0x40:
      goto switchD_001a4aa6_caseD_40;
    case 0x41:
      goto switchD_001a4aa6_caseD_41;
    case 0x42:
      goto switchD_001a4aa6_caseD_42;
    case 0x43:
      goto switchD_001a4aa6_caseD_43;
    case 0x44:
      goto switchD_001a4aa6_caseD_44;
    case 0x45:
      goto switchD_001a4aa6_caseD_45;
    case 0x46:
      goto switchD_001a4aa6_caseD_46;
    }
  }
  if (uVar32 < 0x1000000) {
    if (sVar28 == in_size) {
      *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0;
      uVar31 = uVar12;
      goto LAB_001a7605;
    }
    uVar32 = uVar32 << 8;
    pbVar1 = in + sVar28;
    sVar28 = sVar28 + 1;
    uVar12 = (uint)*pbVar1 | uVar12 << 8;
  }
LAB_001a7cad:
  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 1;
  uVar31 = uVar12;
LAB_001a7605:
  lVar15 = LZMA_OK;
  bVar10 = true;
  uVar12 = uVar31;
LAB_001a760f:
  dictptr->pos = local_c8;
  dictptr->full = local_c0;
  *(uint *)((long)coder_ptr + 0x6e6c) = uVar32;
  *(uint *)((long)coder_ptr + 0x6e70) = uVar12;
  *(undefined4 *)((long)coder_ptr + 0x6e74) = uVar3;
  *in_pos = sVar28;
  *(lzma_lzma_state *)((long)coder_ptr + 0x6e78) = lVar30;
  *(int *)((long)coder_ptr + 0x6e7c) = (int)uVar27;
  *(uint *)((long)coder_ptr + 0x6e80) = local_dc;
  *(uint *)((long)coder_ptr + 0x6e84) = local_e0;
  *(uint *)((long)coder_ptr + 0x6e88) = local_ac;
  *(void **)((long)coder_ptr + 0x6ea8) = pvVar34;
  *(int *)((long)coder_ptr + 0x6eb0) = (int)uVar24;
  *(uint *)((long)coder_ptr + 0x6eb4) = uVar18;
  *(uint *)((long)coder_ptr + 0x6eb8) = uVar14;
  *(int *)((long)coder_ptr + 0x6ebc) = (int)uVar17;
  if ((*(long *)((long)coder_ptr + 0x6e98) != -1) &&
     (lVar29 = *(long *)((long)coder_ptr + 0x6e98) + (uVar7 - local_c8),
     *(long *)((long)coder_ptr + 0x6e98) = lVar29, bVar10 && lVar29 == 0)) {
    if (*(int *)((long)coder_ptr + 0x6ea0) == 0) {
      lVar15 = LZMA_OK;
    }
    else {
      lVar15 = (uint)(*(int *)((long)coder_ptr + 0x6ea0) != 1) * 8 + LZMA_STREAM_END;
    }
  }
  if (lVar15 == LZMA_STREAM_END) {
    lVar15 = (uint)(uVar12 != 0) * 8 + LZMA_STREAM_END;
    *(undefined8 *)((long)coder_ptr + 0x6e6c) = 0xffffffff;
    *(undefined4 *)((long)coder_ptr + 0x6e74) = 5;
  }
  return lVar15;
switchD_001a4aa6_caseD_30:
  lVar15 = LZMA_STREAM_END;
  if (0xffffff < uVar32) {
LAB_001a75ee:
    bVar10 = false;
    goto LAB_001a760f;
  }
  if (sVar28 != in_size) {
    uVar32 = uVar32 << 8;
    pbVar1 = in + sVar28;
    sVar28 = sVar28 + 1;
    bVar10 = false;
    uVar12 = (uint)*pbVar1 | uVar12 << 8;
    goto LAB_001a760f;
  }
  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x30;
  uVar31 = uVar12;
  goto LAB_001a7605;
}

Assistant:

static lzma_ret
lzma_decode(void *coder_ptr, lzma_dict *restrict dictptr,
		const uint8_t *restrict in,
		size_t *restrict in_pos, size_t in_size)
{
	lzma_lzma1_decoder *restrict coder = coder_ptr;

	////////////////////
	// Initialization //
	////////////////////

	{
		const lzma_ret ret = rc_read_init(
				&coder->rc, in, in_pos, in_size);
		if (ret != LZMA_STREAM_END)
			return ret;
	}

	///////////////
	// Variables //
	///////////////

	// Making local copies of often-used variables improves both
	// speed and readability.

	lzma_dict dict = *dictptr;

	const size_t dict_start = dict.pos;

	// Range decoder
	rc_to_local(coder->rc, *in_pos);

	// State
	uint32_t state = coder->state;
	uint32_t rep0 = coder->rep0;
	uint32_t rep1 = coder->rep1;
	uint32_t rep2 = coder->rep2;
	uint32_t rep3 = coder->rep3;

	const uint32_t pos_mask = coder->pos_mask;

	// These variables are actually needed only if we last time ran
	// out of input in the middle of the decoder loop.
	probability *probs = coder->probs;
	uint32_t symbol = coder->symbol;
	uint32_t limit = coder->limit;
	uint32_t offset = coder->offset;
	uint32_t len = coder->len;

	const uint32_t literal_pos_mask = coder->literal_pos_mask;
	const uint32_t literal_context_bits = coder->literal_context_bits;

	// Temporary variables
	uint32_t pos_state = dict.pos & pos_mask;

	lzma_ret ret = LZMA_OK;

	// If uncompressed size is known, there must be no end of payload
	// marker.
	const bool no_eopm = coder->uncompressed_size
			!= LZMA_VLI_UNKNOWN;
	if (no_eopm && coder->uncompressed_size < dict.limit - dict.pos)
		dict.limit = dict.pos + (size_t)(coder->uncompressed_size);

	// The main decoder loop. The "switch" is used to restart the decoder at
	// correct location. Once restarted, the "switch" is no longer used.
	switch (coder->sequence)
	while (true) {
		// Calculate new pos_state. This is skipped on the first loop
		// since we already calculated it when setting up the local
		// variables.
		pos_state = dict.pos & pos_mask;

	case SEQ_NORMALIZE:
	case SEQ_IS_MATCH:
		if (unlikely(no_eopm && dict.pos == dict.limit))
			break;

		rc_if_0(coder->is_match[state][pos_state], SEQ_IS_MATCH) {
			rc_update_0(coder->is_match[state][pos_state]);

			// It's a literal i.e. a single 8-bit byte.

			probs = literal_subcoder(coder->literal,
					literal_context_bits, literal_pos_mask,
					dict.pos, dict_get(&dict, 0));
			symbol = 1;

			if (is_literal_state(state)) {
				// Decode literal without match byte.
#ifdef HAVE_SMALL
	case SEQ_LITERAL:
				do {
					rc_bit(probs[symbol], , , SEQ_LITERAL);
				} while (symbol < (1 << 8));
#else
				rc_bit_case(probs[symbol], , , SEQ_LITERAL0);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL1);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL2);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL3);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL4);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL5);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL6);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL7);
#endif
			} else {
				// Decode literal with match byte.
				//
				// We store the byte we compare against
				// ("match byte") to "len" to minimize the
				// number of variables we need to store
				// between decoder calls.
				len = (uint32_t)(dict_get(&dict, rep0)) << 1;

				// The usage of "offset" allows omitting some
				// branches, which should give tiny speed
				// improvement on some CPUs. "offset" gets
				// set to zero if match_bit didn't match.
				offset = 0x100;

#ifdef HAVE_SMALL
	case SEQ_LITERAL_MATCHED:
				do {
					const uint32_t match_bit
							= len & offset;
					const uint32_t subcoder_index
							= offset + match_bit
							+ symbol;

					rc_bit(probs[subcoder_index],
							offset &= ~match_bit,
							offset &= match_bit,
							SEQ_LITERAL_MATCHED);

					// It seems to be faster to do this
					// here instead of putting it to the
					// beginning of the loop and then
					// putting the "case" in the middle
					// of the loop.
					len <<= 1;

				} while (symbol < (1 << 8));
#else
				// Unroll the loop.
				uint32_t match_bit;
				uint32_t subcoder_index;

#	define d(seq) \
		case seq: \
			match_bit = len & offset; \
			subcoder_index = offset + match_bit + symbol; \
			rc_bit(probs[subcoder_index], \
					offset &= ~match_bit, \
					offset &= match_bit, \
					seq)

				d(SEQ_LITERAL_MATCHED0);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED1);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED2);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED3);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED4);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED5);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED6);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED7);
#	undef d
#endif
			}

			//update_literal(state);
			// Use a lookup table to update to literal state,
			// since compared to other state updates, this would
			// need two branches.
			static const lzma_lzma_state next_state[] = {
				STATE_LIT_LIT,
				STATE_LIT_LIT,
				STATE_LIT_LIT,
				STATE_LIT_LIT,
				STATE_MATCH_LIT_LIT,
				STATE_REP_LIT_LIT,
				STATE_SHORTREP_LIT_LIT,
				STATE_MATCH_LIT,
				STATE_REP_LIT,
				STATE_SHORTREP_LIT,
				STATE_MATCH_LIT,
				STATE_REP_LIT
			};
			state = next_state[state];

	case SEQ_LITERAL_WRITE:
			if (unlikely(dict_put(&dict, symbol))) {
				coder->sequence = SEQ_LITERAL_WRITE;
				goto out;
			}

			continue;
		}

		// Instead of a new byte we are going to get a byte range
		// (distance and length) which will be repeated from our
		// output history.

		rc_update_1(coder->is_match[state][pos_state]);

	case SEQ_IS_REP:
		rc_if_0(coder->is_rep[state], SEQ_IS_REP) {
			// Not a repeated match
			rc_update_0(coder->is_rep[state]);
			update_match(state);

			// The latest three match distances are kept in
			// memory in case there are repeated matches.
			rep3 = rep2;
			rep2 = rep1;
			rep1 = rep0;

			// Decode the length of the match.
			len_decode(len, coder->match_len_decoder,
					pos_state, SEQ_MATCH_LEN);

			// Prepare to decode the highest two bits of the
			// match distance.
			probs = coder->dist_slot[get_dist_state(len)];
			symbol = 1;

#ifdef HAVE_SMALL
	case SEQ_DIST_SLOT:
			do {
				rc_bit(probs[symbol], , , SEQ_DIST_SLOT);
			} while (symbol < DIST_SLOTS);
#else
			rc_bit_case(probs[symbol], , , SEQ_DIST_SLOT0);
			rc_bit_case(probs[symbol], , , SEQ_DIST_SLOT1);
			rc_bit_case(probs[symbol], , , SEQ_DIST_SLOT2);
			rc_bit_case(probs[symbol], , , SEQ_DIST_SLOT3);
			rc_bit_case(probs[symbol], , , SEQ_DIST_SLOT4);
			rc_bit_case(probs[symbol], , , SEQ_DIST_SLOT5);
#endif
			// Get rid of the highest bit that was needed for
			// indexing of the probability array.
			symbol -= DIST_SLOTS;
			assert(symbol <= 63);

			if (symbol < DIST_MODEL_START) {
				// Match distances [0, 3] have only two bits.
				rep0 = symbol;
			} else {
				// Decode the lowest [1, 29] bits of
				// the match distance.
				limit = (symbol >> 1) - 1;
				assert(limit >= 1 && limit <= 30);
				rep0 = 2 + (symbol & 1);

				if (symbol < DIST_MODEL_END) {
					// Prepare to decode the low bits for
					// a distance of [4, 127].
					assert(limit <= 5);
					rep0 <<= limit;
					assert(rep0 <= 96);
					// -1 is fine, because we start
					// decoding at probs[1], not probs[0].
					// NOTE: This violates the C standard,
					// since we are doing pointer
					// arithmetic past the beginning of
					// the array.
					assert((int32_t)(rep0 - symbol - 1)
							>= -1);
					assert((int32_t)(rep0 - symbol - 1)
							<= 82);
					probs = coder->pos_special + rep0
							- symbol - 1;
					symbol = 1;
					offset = 0;
	case SEQ_DIST_MODEL:
#ifdef HAVE_SMALL
					do {
						rc_bit(probs[symbol], ,
							rep0 += 1U << offset,
							SEQ_DIST_MODEL);
					} while (++offset < limit);
#else
					switch (limit) {
					case 5:
						assert(offset == 0);
						rc_bit(probs[symbol], ,
							rep0 += 1U,
							SEQ_DIST_MODEL);
						++offset;
						--limit;
					case 4:
						rc_bit(probs[symbol], ,
							rep0 += 1U << offset,
							SEQ_DIST_MODEL);
						++offset;
						--limit;
					case 3:
						rc_bit(probs[symbol], ,
							rep0 += 1U << offset,
							SEQ_DIST_MODEL);
						++offset;
						--limit;
					case 2:
						rc_bit(probs[symbol], ,
							rep0 += 1U << offset,
							SEQ_DIST_MODEL);
						++offset;
						--limit;
					case 1:
						// We need "symbol" only for
						// indexing the probability
						// array, thus we can use
						// rc_bit_last() here to omit
						// the unneeded updating of
						// "symbol".
						rc_bit_last(probs[symbol], ,
							rep0 += 1U << offset,
							SEQ_DIST_MODEL);
					}
#endif
				} else {
					// The distance is >= 128. Decode the
					// lower bits without probabilities
					// except the lowest four bits.
					assert(symbol >= 14);
					assert(limit >= 6);
					limit -= ALIGN_BITS;
					assert(limit >= 2);
	case SEQ_DIRECT:
					// Not worth manual unrolling
					do {
						rc_direct(rep0, SEQ_DIRECT);
					} while (--limit > 0);

					// Decode the lowest four bits using
					// probabilities.
					rep0 <<= ALIGN_BITS;
					symbol = 1;
#ifdef HAVE_SMALL
					offset = 0;
	case SEQ_ALIGN:
					do {
						rc_bit(coder->pos_align[
								symbol], ,
							rep0 += 1U << offset,
							SEQ_ALIGN);
					} while (++offset < ALIGN_BITS);
#else
	case SEQ_ALIGN0:
					rc_bit(coder->pos_align[symbol], ,
							rep0 += 1, SEQ_ALIGN0);
	case SEQ_ALIGN1:
					rc_bit(coder->pos_align[symbol], ,
							rep0 += 2, SEQ_ALIGN1);
	case SEQ_ALIGN2:
					rc_bit(coder->pos_align[symbol], ,
							rep0 += 4, SEQ_ALIGN2);
	case SEQ_ALIGN3:
					// Like in SEQ_DIST_MODEL, we don't
					// need "symbol" for anything else
					// than indexing the probability array.
					rc_bit_last(coder->pos_align[symbol], ,
							rep0 += 8, SEQ_ALIGN3);
#endif

					if (rep0 == UINT32_MAX) {
						// End of payload marker was
						// found. It must not be
						// present if uncompressed
						// size is known.
						if (coder->uncompressed_size
						!= LZMA_VLI_UNKNOWN) {
							ret = LZMA_DATA_ERROR;
							goto out;
						}

	case SEQ_EOPM:
						// LZMA1 stream with
						// end-of-payload marker.
						rc_normalize(SEQ_EOPM);
						ret = LZMA_STREAM_END;
						goto out;
					}
				}
			}

			// Validate the distance we just decoded.
			if (unlikely(!dict_is_distance_valid(&dict, rep0))) {
				ret = LZMA_DATA_ERROR;
				goto out;
			}

		} else {
			rc_update_1(coder->is_rep[state]);

			// Repeated match
			//
			// The match distance is a value that we have had
			// earlier. The latest four match distances are
			// available as rep0, rep1, rep2 and rep3. We will
			// now decode which of them is the new distance.
			//
			// There cannot be a match if we haven't produced
			// any output, so check that first.
			if (unlikely(!dict_is_distance_valid(&dict, 0))) {
				ret = LZMA_DATA_ERROR;
				goto out;
			}

	case SEQ_IS_REP0:
			rc_if_0(coder->is_rep0[state], SEQ_IS_REP0) {
				rc_update_0(coder->is_rep0[state]);
				// The distance is rep0.

	case SEQ_IS_REP0_LONG:
				rc_if_0(coder->is_rep0_long[state][pos_state],
						SEQ_IS_REP0_LONG) {
					rc_update_0(coder->is_rep0_long[
							state][pos_state]);

					update_short_rep(state);

	case SEQ_SHORTREP:
					if (unlikely(dict_put(&dict, dict_get(
							&dict, rep0)))) {
						coder->sequence = SEQ_SHORTREP;
						goto out;
					}

					continue;
				}

				// Repeating more than one byte at
				// distance of rep0.
				rc_update_1(coder->is_rep0_long[
						state][pos_state]);

			} else {
				rc_update_1(coder->is_rep0[state]);

	case SEQ_IS_REP1:
				// The distance is rep1, rep2 or rep3. Once
				// we find out which one of these three, it
				// is stored to rep0 and rep1, rep2 and rep3
				// are updated accordingly.
				rc_if_0(coder->is_rep1[state], SEQ_IS_REP1) {
					rc_update_0(coder->is_rep1[state]);

					const uint32_t distance = rep1;
					rep1 = rep0;
					rep0 = distance;

				} else {
					rc_update_1(coder->is_rep1[state]);
	case SEQ_IS_REP2:
					rc_if_0(coder->is_rep2[state],
							SEQ_IS_REP2) {
						rc_update_0(coder->is_rep2[
								state]);

						const uint32_t distance = rep2;
						rep2 = rep1;
						rep1 = rep0;
						rep0 = distance;

					} else {
						rc_update_1(coder->is_rep2[
								state]);

						const uint32_t distance = rep3;
						rep3 = rep2;
						rep2 = rep1;
						rep1 = rep0;
						rep0 = distance;
					}
				}
			}

			update_long_rep(state);

			// Decode the length of the repeated match.
			len_decode(len, coder->rep_len_decoder,
					pos_state, SEQ_REP_LEN);
		}

		/////////////////////////////////
		// Repeat from history buffer. //
		/////////////////////////////////

		// The length is always between these limits. There is no way
		// to trigger the algorithm to set len outside this range.
		assert(len >= MATCH_LEN_MIN);
		assert(len <= MATCH_LEN_MAX);

	case SEQ_COPY:
		// Repeat len bytes from distance of rep0.
		if (unlikely(dict_repeat(&dict, rep0, &len))) {
			coder->sequence = SEQ_COPY;
			goto out;
		}
	}

	rc_normalize(SEQ_NORMALIZE);
	coder->sequence = SEQ_IS_MATCH;

out:
	// Save state

	// NOTE: Must not copy dict.limit.
	dictptr->pos = dict.pos;
	dictptr->full = dict.full;

	rc_from_local(coder->rc, *in_pos);

	coder->state = state;
	coder->rep0 = rep0;
	coder->rep1 = rep1;
	coder->rep2 = rep2;
	coder->rep3 = rep3;

	coder->probs = probs;
	coder->symbol = symbol;
	coder->limit = limit;
	coder->offset = offset;
	coder->len = len;

	// Update the remaining amount of uncompressed data if uncompressed
	// size was known.
	if (coder->uncompressed_size != LZMA_VLI_UNKNOWN) {
		coder->uncompressed_size -= dict.pos - dict_start;

		// Since there cannot be end of payload marker if the
		// uncompressed size was known, we check here if we
		// finished decoding.
		if (coder->uncompressed_size == 0 && ret == LZMA_OK
				&& coder->sequence != SEQ_NORMALIZE)
			ret = coder->sequence == SEQ_IS_MATCH
					? LZMA_STREAM_END : LZMA_DATA_ERROR;
	}

	// We can do an additional check in the range decoder to catch some
	// corrupted files.
	if (ret == LZMA_STREAM_END) {
		if (!rc_is_finished(coder->rc))
			ret = LZMA_DATA_ERROR;

		// Reset the range decoder so that it is ready to reinitialize
		// for a new LZMA2 chunk.
		rc_reset(coder->rc);
	}

	return ret;
}